

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O2

void undo_perm32(uchar *mat,int *P,int n)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  undefined4 uVar6;
  uchar *puVar7;
  uchar *puVar8;
  undefined4 uVar9;
  int c;
  ulong uVar10;
  
  uVar1 = n / 0x20;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  lVar2 = (long)(int)uVar1;
  lVar3 = (long)n;
  puVar7 = mat + (lVar3 + -1) * lVar2 * 4;
  while (0 < lVar3) {
    lVar3 = lVar3 + -1;
    puVar8 = mat;
    for (uVar5 = 0; uVar5 != (uint)n; uVar5 = uVar5 + 1) {
      uVar1 = P[lVar3];
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        uVar6 = *(undefined4 *)(puVar7 + uVar10 * 4);
        uVar9 = *(undefined4 *)(puVar8 + uVar10 * 4);
        if (uVar5 != uVar1) {
          uVar9 = uVar6;
        }
        *(undefined4 *)(puVar7 + uVar10 * 4) = uVar9;
        if (uVar5 != uVar1) {
          uVar6 = *(undefined4 *)(puVar8 + uVar10 * 4);
        }
        *(undefined4 *)(puVar8 + uVar10 * 4) = uVar6;
      }
      puVar8 = puVar8 + lVar2 * 4;
    }
    puVar7 = puVar7 + lVar2 * -4;
  }
  return;
}

Assistant:

void undo_perm32(unsigned char *mat, int *P, int n)
{
  uint32_t mask_cpy;
  uint32_t tmp;
  uint32_t *mat_32_ptr = (uint32_t*)mat;

  for(int i = n-1; i >= 0; i--)
  {
    for(int j = 0; j < n; j++)
    {
      mask_cpy = (j == P[i]);
      mask_cpy = -mask_cpy;

      for(int c = 0; c < n/32; c++)
      {
        tmp = mat_32_ptr[(n/32)*i + c];
        mat_32_ptr[(n/32)*i + c] = (mat_32_ptr[(n/32)*i + c] & ~mask_cpy) | (mat_32_ptr[(n/32)*j + c] & mask_cpy);
        mat_32_ptr[(n/32)*j + c] = (mat_32_ptr[(n/32)*j + c] & ~mask_cpy) | (tmp & mask_cpy);
      }
    }
  }
}